

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> *
ParseHexV(vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,UniValue *v,
         string_view name)

{
  long lVar1;
  bool bVar2;
  string *__str;
  UniValue *__return_storage_ptr___00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  long in_FS_OFFSET;
  string_view str;
  string_view hex_str;
  string_view name_local;
  string local_60;
  string strHex;
  
  name_local._M_str = name._M_str;
  name_local._M_len = name._M_len;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  strHex._M_dataplus._M_p = (pointer)&strHex.field_2;
  strHex._M_string_length = 0;
  strHex.field_2._M_local_buf[0] = '\0';
  if (v->typ == VSTR) {
    __str = UniValue::get_str_abi_cxx11_(v);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&strHex,__str);
  }
  str._M_str = strHex._M_dataplus._M_p;
  str._M_len = strHex._M_string_length;
  bVar2 = IsHex(str);
  if (bVar2) {
    hex_str._M_str = strHex._M_dataplus._M_p;
    hex_str._M_len = strHex._M_string_length;
    ParseHex<unsigned_char>(__return_storage_ptr__,hex_str);
    std::__cxx11::string::~string((string *)&strHex);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return __return_storage_ptr__;
    }
  }
  else {
    __return_storage_ptr___00 = (UniValue *)__cxa_allocate_exception(0x58);
    tinyformat::format<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>
              (&local_60,(tinyformat *)"%s must be hexadecimal string (not \'%s\')",
               (char *)&name_local,(basic_string_view<char,_std::char_traits<char>_> *)&strHex,in_R8
              );
    JSONRPCError(__return_storage_ptr___00,-8,&local_60);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(__return_storage_ptr___00,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
  __stack_chk_fail();
}

Assistant:

std::vector<unsigned char> ParseHexV(const UniValue& v, std::string_view name)
{
    std::string strHex;
    if (v.isStr())
        strHex = v.get_str();
    if (!IsHex(strHex))
        throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("%s must be hexadecimal string (not '%s')", name, strHex));
    return ParseHex(strHex);
}